

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O2

void __thiscall Imf_3_2::Array<Imf_3_2::Rgba>::Array(Array<Imf_3_2::Rgba> *this,long size)

{
  Rgba *pRVar1;
  
  pRVar1 = (Rgba *)operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | size * 8);
  this->_data = pRVar1;
  this->_size = size;
  return;
}

Assistant:

Array (long size)
    {
        _data = new T[size];
        _size = size;
    }